

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall icu_63::DecimalFormat::setMaximumIntegerDigits(DecimalFormat *this,int32_t newValue)

{
  DecimalFormatProperties *pDVar1;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if (pDVar1->maximumIntegerDigits == newValue) {
    return;
  }
  if (newValue < pDVar1->minimumIntegerDigits && -1 < pDVar1->minimumIntegerDigits) {
    pDVar1->minimumIntegerDigits = newValue;
  }
  pDVar1->maximumIntegerDigits = newValue;
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setMaximumIntegerDigits(int32_t newValue) {
    if (newValue == fields->properties->maximumIntegerDigits) { return; }
    // For backwards compatibility, conflicting min/max need to keep the most recent setting.
    int32_t min = fields->properties->minimumIntegerDigits;
    if (min >= 0 && min > newValue) {
        fields->properties->minimumIntegerDigits = newValue;
    }
    fields->properties->maximumIntegerDigits = newValue;
    touchNoError();
}